

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  int iVar1;
  string *psVar2;
  string *extraout_RAX;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  StringOutputStream *pSVar7;
  long *plVar8;
  ulong unaff_R14;
  undefined1 auStack_1078 [4104];
  StringOutputStream *pSStack_70;
  long lStack_38;
  code *pcStack_30;
  StringOutputStream SStack_28;
  
  uVar6 = CONCAT44(in_register_00000034,count);
  pSVar7 = &SStack_28;
  if (count < 0) {
    uVar6 = 0;
    pcStack_30 = (code *)0x2bcee7;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)count,0,"count >= 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 != (string *)0x0) {
    pcStack_30 = (code *)0x2bcf0d;
    BackUp();
    psVar2 = extraout_RAX;
    goto LAB_002bcf0d;
  }
  if (this->target_ == (string *)0x0) {
    pcStack_30 = (code *)0x2bcef1;
    BackUp(&SStack_28);
LAB_002bcef1:
    pcStack_30 = (code *)0x2bcf00;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (unaff_R14,uVar6,"static_cast<size_t>(count) <= target_->size()");
  }
  else {
    unaff_R14 = (ulong)count;
    uVar6 = this->target_->_M_string_length;
    if (uVar6 < unaff_R14) goto LAB_002bcef1;
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    std::__cxx11::string::resize
              ((ulong)this->target_,(char)this->target_->_M_string_length - (char)unaff_R14);
    return;
  }
LAB_002bcf0d:
  iVar5 = (int)psVar2;
  pcStack_30 = ByteCount;
  BackUp();
  if (*(long *)((long)pSVar7 + 8) != 0) {
    return;
  }
  plVar8 = &lStack_38;
  ByteCount();
  iVar3 = 0;
  pSStack_70 = this;
  do {
    iVar4 = iVar5 - iVar3;
    if (iVar4 == 0 || iVar5 < iVar3) {
      return;
    }
    if (0xfff < iVar4) {
      iVar4 = 0x1000;
    }
    iVar1 = (**(code **)(*plVar8 + 0x10))(plVar8,auStack_1078,iVar4);
    iVar4 = 0;
    if (0 < iVar1) {
      iVar4 = iVar1;
    }
    iVar3 = iVar4 + iVar3;
  } while (0 < iVar1);
  return;
}

Assistant:

void StringOutputStream::BackUp(int count) {
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK(target_ != nullptr);
  ABSL_CHECK_LE(static_cast<size_t>(count), target_->size());
  target_->resize(target_->size() - count);
}